

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O2

void __thiscall
FIX::SocketInitiator::onConnect(SocketInitiator *this,SocketConnector *param_1,socket_handle s)

{
  SocketConnection *this_00;
  iterator __position;
  mapped_type *ppSVar1;
  key_type local_24;
  
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
               ::find(&(this->m_pendingConnections)._M_t,&local_24);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (SocketConnection *)__position._M_node[1]._M_parent;
    ppSVar1 = std::
              map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::operator[](&this->m_connections,&local_24);
    *ppSVar1 = this_00;
    std::
    _Rb_tree<int,std::pair<int_const,FIX::SocketConnection*>,std::_Select1st<std::pair<int_const,FIX::SocketConnection*>>,std::less<int>,std::allocator<std::pair<int_const,FIX::SocketConnection*>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,FIX::SocketConnection*>,std::_Select1st<std::pair<int_const,FIX::SocketConnection*>>,std::less<int>,std::allocator<std::pair<int_const,FIX::SocketConnection*>>>
                        *)&this->m_pendingConnections,__position);
    Initiator::setConnected(&this->super_Initiator,&this_00->m_pSession->m_sessionID);
    SocketConnection::onTimeout(this_00);
  }
  return;
}

Assistant:

void SocketInitiator::onConnect(SocketConnector &, socket_handle s) {
  SocketConnections::iterator i = m_pendingConnections.find(s);
  if (i == m_pendingConnections.end()) {
    return;
  }
  SocketConnection *pSocketConnection = i->second;

  m_connections[s] = pSocketConnection;
  m_pendingConnections.erase(i);
  setConnected(pSocketConnection->getSession()->getSessionID());
  pSocketConnection->onTimeout();
}